

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ComparisonTestT<unsigned_short>(void)

{
  ComparisonTestTU<unsigned_short,char>();
  ComparisonTestTU<unsigned_short,signed_char>();
  ComparisonTestTU<unsigned_short,unsigned_char>();
  ComparisonTestTU<unsigned_short,short>();
  ComparisonTestTU<unsigned_short,unsigned_short>();
  ComparisonTestTU<unsigned_short,int>();
  ComparisonTestTU<unsigned_short,unsigned_int>();
  ComparisonTestTU<unsigned_short,long>();
  ComparisonTestTU<unsigned_short,unsigned_long>();
  ComparisonTestTU<unsigned_short,long_long>();
  ComparisonTestTU<unsigned_short,unsigned_long_long>();
  return;
}

Assistant:

void ComparisonTestT()
	{
		ComparisonTestTU<T, char>();
		ComparisonTestTU<T, signed char>();
		ComparisonTestTU<T, unsigned char>();
		ComparisonTestTU<T, signed short>();
		ComparisonTestTU<T, unsigned short>();
		ComparisonTestTU<T, signed int>();
		ComparisonTestTU<T, unsigned int>();
		ComparisonTestTU<T, signed long>();
		ComparisonTestTU<T, unsigned long>();
		ComparisonTestTU<T, signed long long>();
		ComparisonTestTU<T, unsigned long long>();
	}